

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

char * lua_pushvfstring(lua_State *L,char *fmt,__va_list_tag *argp)

{
  char *pcVar1;
  char *ret;
  __va_list_tag *argp_local;
  char *fmt_local;
  lua_State *L_local;
  
  pcVar1 = luaO_pushvfstring(L,fmt,argp);
  if (L->l_G->GCdebt < 1) {
    luaC_step(L);
  }
  return pcVar1;
}

Assistant:

LUA_API const char *lua_pushvfstring (lua_State *L, const char *fmt,
                                      va_list argp) {
  const char *ret;
  lua_lock(L);
  ret = luaO_pushvfstring(L, fmt, argp);
  luaC_checkGC(L);
  lua_unlock(L);
  return ret;
}